

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall cmFindPackageCommand::FillPrefixesPackageRoot(cmFindPackageCommand *this)

{
  mapped_type *this_00;
  cmMakefile *pcVar1;
  _Elt_pointer pbVar2;
  _Elt_pointer pbVar3;
  _Map_pointer ppbVar4;
  _Elt_pointer pbVar5;
  string varName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = std::
            map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
            ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                         &cmFindCommon::PathLabel::PackageRoot);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  pbVar2 = (pcVar1->FindPackageModuleStack).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_first;
  ppbVar4 = (pcVar1->FindPackageModuleStack).
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  for (pbVar5 = (pcVar1->FindPackageModuleStack).
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      pbVar5 != (pcVar1->FindPackageModuleStack).
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur; pbVar5 = pbVar5 + -1) {
    pbVar3 = pbVar5;
    if (pbVar5 == pbVar2) {
      pbVar3 = ppbVar4[-1] + 0x10;
    }
    std::operator+(&local_50,pbVar3 + -1,"_ROOT");
    cmSearchPath::AddCMakePath(this_00,&local_50);
    cmSearchPath::AddEnvPath(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (pbVar5 == pbVar2) {
      pbVar2 = ppbVar4[-1];
      ppbVar4 = ppbVar4 + -1;
      pbVar5 = pbVar2 + 0x10;
    }
    pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  }
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesPackageRoot()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::PackageRoot];

  // Add package specific search prefixes
  // NOTE: This should be using const_reverse_iterator but HP aCC and
  //       Oracle sunCC both currently have standard library issues
  //       with the reverse iterator APIs.
  for (std::deque<std::string>::reverse_iterator pkg =
         this->Makefile->FindPackageModuleStack.rbegin();
       pkg != this->Makefile->FindPackageModuleStack.rend(); ++pkg) {
    std::string varName = *pkg + "_ROOT";
    paths.AddCMakePath(varName);
    paths.AddEnvPath(varName);
  }
}